

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.h
# Opt level: O0

TestAllTypesLite_NestedMessage * __thiscall
proto2_unittest::TestAllTypesLite::_internal_mutable_optional_unverified_lazy_message
          (TestAllTypesLite *this)

{
  Arena *arena;
  TestAllTypesLite_NestedMessage *pTVar1;
  TestAllTypesLite_NestedMessage *p;
  TestAllTypesLite *this_local;
  
  if ((this->field_0)._impl_.optional_unverified_lazy_message_ ==
      (TestAllTypesLite_NestedMessage *)0x0) {
    arena = google::protobuf::MessageLite::GetArena(&this->super_MessageLite);
    pTVar1 = (TestAllTypesLite_NestedMessage *)
             google::protobuf::Arena::
             DefaultConstruct<proto2_unittest::TestAllTypesLite_NestedMessage>(arena);
    (this->field_0)._impl_.optional_unverified_lazy_message_ = pTVar1;
  }
  return (this->field_0)._impl_.optional_unverified_lazy_message_;
}

Assistant:

inline ::proto2_unittest::TestAllTypesLite_NestedMessage* PROTOBUF_NONNULL TestAllTypesLite::_internal_mutable_optional_unverified_lazy_message() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.optional_unverified_lazy_message_ == nullptr) {
    auto* p = ::google::protobuf::MessageLite::DefaultConstruct<::proto2_unittest::TestAllTypesLite_NestedMessage>(GetArena());
    _impl_.optional_unverified_lazy_message_ = reinterpret_cast<::proto2_unittest::TestAllTypesLite_NestedMessage*>(p);
  }
  return _impl_.optional_unverified_lazy_message_;
}